

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_cast(ggml_context *ctx,ggml_tensor *a,ggml_type type)

{
  ggml_tensor *tensor;
  
  tensor = ggml_new_tensor(ctx,type,4,a->ne);
  ggml_format_name(tensor,"%s (copy)",a->name);
  tensor->op = GGML_OP_CPY;
  tensor->src[0] = a;
  tensor->src[1] = tensor;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_cast(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        enum   ggml_type      type) {
    struct ggml_tensor * result = ggml_new_tensor(ctx, type, GGML_MAX_DIMS, a->ne);
    ggml_format_name(result, "%s (copy)", a->name);

    result->op     = GGML_OP_CPY;
    result->src[0] = a;
    result->src[1] = result;

    return result;
}